

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O3

char * google::protobuf::internal::anon_unknown_0::ParseTimezoneOffset(char *data,int64 *offset)

{
  long lVar1;
  char *pcVar2;
  uint uVar3;
  char *pcVar4;
  uint uVar5;
  
  uVar3 = 0;
  if ((byte)(*data - 0x30U) < 10) {
    pcVar2 = data + 2;
    lVar1 = 0;
    do {
      if (9 < (byte)(data[lVar1] - 0x30U)) {
        pcVar2 = data + lVar1;
        break;
      }
      uVar3 = ((uint)(byte)data[lVar1] + uVar3 * 10) - 0x30;
      lVar1 = lVar1 + 1;
    } while ((int)lVar1 != 2);
    if ((pcVar2 != (char *)0x0) && (uVar3 < 0x18)) {
      if ((*pcVar2 == ':') && (uVar5 = 0, (byte)(pcVar2[1] - 0x30U) < 10)) {
        pcVar4 = pcVar2 + 3;
        lVar1 = 0;
        do {
          if (9 < (byte)(pcVar2[lVar1 + 1] - 0x30U)) {
            pcVar4 = pcVar2 + lVar1 + 1;
            break;
          }
          uVar5 = ((uint)(byte)pcVar2[lVar1 + 1] + uVar5 * 10) - 0x30;
          lVar1 = lVar1 + 1;
        } while ((int)lVar1 != 2);
        pcVar2 = (char *)0x0;
        if ((pcVar4 != (char *)0x0) && (uVar5 < 0x3c)) {
          *offset = (ulong)((uVar5 + uVar3 * 0x3c) * 0x3c);
          pcVar2 = pcVar4;
        }
      }
      else {
        pcVar2 = (char *)0x0;
      }
      return pcVar2;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* ParseInt(const char* data, int width, int min_value,
                     int max_value, int* result) {
  if (!ascii_isdigit(*data)) {
    return nullptr;
  }
  int value = 0;
  for (int i = 0; i < width; ++i, ++data) {
    if (ascii_isdigit(*data)) {
      value = value * 10 + (*data - '0');
    } else {
      break;
    }
  }
  if (value >= min_value && value <= max_value) {
    *result = value;
    return data;
  } else {
    return nullptr;
  }
}